

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-https-connect.c
# Opt level: O2

CURLcode cf_hc_query(Curl_cfilter *cf,Curl_easy *data,int query,int *pres1,void *pres2)

{
  Curl_cfilter *pCVar1;
  int query_00;
  CURLcode CVar2;
  curltime cVar3;
  
  if ((cf->field_0x24 & 1) == 0) {
    if (query == 5) {
      query_00 = 5;
    }
    else {
      if (query != 4) goto LAB_00586d10;
      query_00 = 4;
    }
    cVar3 = cf_get_max_baller_time(cf,data,query_00);
    *(time_t *)pres2 = cVar3.tv_sec;
    *(int *)((long)pres2 + 8) = cVar3.tv_usec;
    CVar2 = CURLE_OK;
  }
  else {
LAB_00586d10:
    pCVar1 = cf->next;
    if (pCVar1 != (Curl_cfilter *)0x0) {
      CVar2 = (*pCVar1->cft->query)(pCVar1,data,query,pres1,pres2);
      return CVar2;
    }
    CVar2 = CURLE_UNKNOWN_OPTION;
  }
  return CVar2;
}

Assistant:

static CURLcode cf_hc_query(struct Curl_cfilter *cf,
                            struct Curl_easy *data,
                            int query, int *pres1, void *pres2)
{
  if(!cf->connected) {
    switch(query) {
    case CF_QUERY_TIMER_CONNECT: {
      struct curltime *when = pres2;
      *when = cf_get_max_baller_time(cf, data, CF_QUERY_TIMER_CONNECT);
      return CURLE_OK;
    }
    case CF_QUERY_TIMER_APPCONNECT: {
      struct curltime *when = pres2;
      *when = cf_get_max_baller_time(cf, data, CF_QUERY_TIMER_APPCONNECT);
      return CURLE_OK;
    }
    default:
      break;
    }
  }
  return cf->next?
    cf->next->cft->query(cf->next, data, query, pres1, pres2) :
    CURLE_UNKNOWN_OPTION;
}